

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbformat.cc
# Opt level: O0

void __thiscall leveldb::LookupKey::LookupKey(LookupKey *this,Slice *user_key,SequenceNumber s)

{
  size_t __n;
  char *__dest;
  char *__src;
  uint64_t value;
  uint64_t in_RDX;
  Slice *in_RSI;
  undefined8 *in_RDI;
  char *dst;
  size_t needed;
  size_t usize;
  char *local_30;
  
  __n = Slice::size(in_RSI);
  if (__n + 0xd < 0xc9) {
    local_30 = (char *)(in_RDI + 3);
  }
  else {
    local_30 = (char *)operator_new__(__n + 0xd);
  }
  *in_RDI = local_30;
  __dest = EncodeVarint32(local_30,(int)__n + 8);
  in_RDI[1] = __dest;
  __src = Slice::data(in_RSI);
  memcpy(__dest,__src,__n);
  value = PackSequenceAndType(in_RDX,kTypeValue);
  EncodeFixed64(__dest + __n,value);
  in_RDI[2] = __dest + __n + 8;
  return;
}

Assistant:

LookupKey::LookupKey(const Slice& user_key, SequenceNumber s) {
  size_t usize = user_key.size();
  size_t needed = usize + 13;  // A conservative estimate
  char* dst;
  if (needed <= sizeof(space_)) {
    dst = space_;
  } else {
    dst = new char[needed];
  }
  start_ = dst;
  dst = EncodeVarint32(dst, (uint32_t)usize + 8);
  kstart_ = dst;
  memcpy(dst, user_key.data(), usize);
  dst += usize;
  EncodeFixed64(dst, PackSequenceAndType(s, kValueTypeForSeek));
  dst += 8;
  end_ = dst;
}